

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageChannel.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TypedFlatImageChannel<Imath_3_2::half>::resize
          (TypedFlatImageChannel<Imath_3_2::half> *this)

{
  size_t sVar1;
  half *phVar2;
  size_t i;
  size_t sVar3;
  ulong uVar4;
  
  if (this->_pixels != (half *)0x0) {
    operator_delete__(this->_pixels);
  }
  this->_pixels = (half *)0x0;
  ImageChannel::resize((ImageChannel *)this);
  sVar1 = (this->super_FlatImageChannel).super_ImageChannel._numPixels;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)sVar1) {
    uVar4 = sVar1 * 2;
  }
  phVar2 = (half *)operator_new__(uVar4);
  this->_pixels = phVar2;
  for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
    phVar2[sVar3]._h = 0;
  }
  (*(this->super_FlatImageChannel).super_ImageChannel._vptr_ImageChannel[5])(this);
  return;
}

Assistant:

void
TypedFlatImageChannel<T>::resize ()
{
    delete[] _pixels;
    _pixels = 0;

    FlatImageChannel::resize (); // may throw an exception

    _pixels = new T[numPixels ()];

    for (size_t i = 0; i < numPixels (); ++i)
        _pixels[i] = T (0);

    resetBasePointer ();
}